

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

char * google::protobuf::internal::UnknownFieldParse
                 (uint32 tag,InternalMetadataWithArena *metadata,char *ptr,ParseContext *ctx)

{
  char *pcVar1;
  uint64 in_RCX;
  InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
  *in_RSI;
  uint in_EDI;
  ParseContext *in_stack_ffffffffffffffa8;
  
  pcVar1 = (char *)(ulong)in_EDI;
  if (((uint)*(undefined8 *)in_RSI & 1) == 1) {
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
    ::
    PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
              (in_RSI);
  }
  else {
    InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
    ::mutable_unknown_fields_slow
              ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                *)in_RSI);
  }
  pcVar1 = UnknownFieldParse(in_RCX,(UnknownFieldSet *)in_RSI,pcVar1,in_stack_ffffffffffffffa8);
  return pcVar1;
}

Assistant:

const char* UnknownFieldParse(uint32 tag, InternalMetadataWithArena* metadata,
                              const char* ptr, ParseContext* ctx) {
  return UnknownFieldParse(tag, metadata->mutable_unknown_fields(), ptr, ctx);
}